

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.cpp
# Opt level: O3

int __thiscall IZDeflate::build_bl_tree(IZDeflate *this)

{
  uint uVar1;
  uint uVar2;
  
  scan_tree(this,this->dyn_ltree,(this->l_desc).max_code);
  scan_tree(this,this->dyn_dtree,(this->d_desc).max_code);
  build_tree(this,&this->bl_desc);
  uVar2 = 0x13;
  do {
    uVar1 = uVar2 - 1;
    if (this->bl_tree[this->bl_order[uVar1]].dl.dad != 0) goto LAB_00128394;
    uVar2 = uVar2 - 1;
  } while (3 < uVar2);
  uVar1 = 2;
LAB_00128394:
  this->opt_len = this->opt_len + (long)(int)(uVar1 * 3 + 0x11);
  return uVar1;
}

Assistant:

int IZDeflate::build_bl_tree()
{
    int max_blindex;  /* index of last bit length code of non zero freq */

    /* Determine the bit length frequencies for literal and distance trees */
    scan_tree((ct_data near *)dyn_ltree, l_desc.max_code);
    scan_tree((ct_data near *)dyn_dtree, d_desc.max_code);

    /* Build the bit length tree: */
    build_tree((tree_desc near *)(&bl_desc));
    /* opt_len now includes the length of the tree representations, except
     * the lengths of the bit lengths codes and the 5+5+4 bits for the counts.
     */

    /* Determine the number of bit length codes to send. The pkzip format
     * requires that at least 4 bit length codes be sent. (appnote.txt says
     * 3 but the actual value used is 4.)
     */
    for (max_blindex = BL_CODES-1; max_blindex >= 3; max_blindex--) {
        if (bl_tree[bl_order[max_blindex]].Len != 0) break;
    }
    /* Update opt_len to include the bit length tree and counts */
    opt_len += 3*(max_blindex+1) + 5+5+4;
    Tracev((stderr, "\ndyn trees: dyn %ld, stat %ld", opt_len, static_len));

    return max_blindex;
}